

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O1

void __thiscall
QPainter::drawText(QPainter *this,QPointF *p,QString *str,int tf,int justificationPadding)

{
  QScriptItem *si;
  _Head_base<0UL,_QPainterPrivate_*,_false> _Var1;
  qsizetype qVar2;
  QScriptItem *pQVar3;
  PenStyle PVar4;
  uint uVar5;
  int iVar6;
  QPen *this_00;
  QFontEngine *__size;
  pointer pQVar7;
  char16_t *pcVar8;
  int iVar9;
  size_t allocSize;
  QFontEngine *pQVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  long in_FS_OFFSET;
  QScriptLine line;
  QVarLengthArray<unsigned_char,_256LL> levels;
  QVarLengthArray<int,_256LL> visualOrder;
  QStackTextEngine engine;
  QScriptLine local_2fd8;
  undefined1 local_2fa8 [16];
  undefined1 local_2f98 [16];
  undefined1 *local_2f88;
  undefined1 auStack_2f80 [16];
  undefined1 *puStack_2f70;
  QChar *local_2f68;
  unsigned_short *puStack_2f60;
  QFont *local_2f58;
  QFixedPoint *pQStack_2f50;
  glyph_t *local_2f48;
  QFixed *pQStack_2f40;
  QGlyphJustification *local_2f38;
  QGlyphAttributes *pQStack_2f30;
  undefined1 *local_2f28;
  QFontEngine *pQStack_2f20;
  undefined1 local_2f18 [48];
  quint8 local_2ee8 [256];
  long local_2de8;
  QFontEngine *local_2de0;
  int *local_2dd8;
  int local_2dd0 [256];
  QStackTextEngine local_29d0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  _Var1._M_head_impl =
       (this->d_ptr)._M_t.
       super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
       super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
       super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl;
  if (((tuple<QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor>)
       *(tuple<QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor> *)
        &((_Var1._M_head_impl)->engine)._M_t !=
       (__uniq_ptr_impl<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor>)0x0) &&
     ((str->d).size != 0)) {
    this_00 = pen(this);
    PVar4 = QPen::style(this_00);
    if (PVar4 != NoPen) {
      QStackTextEngine::QStackTextEngine
                (&local_29d0,str,(QFont *)((long)((_Var1._M_head_impl)->state)._M_t + 0x20));
      uVar5 = local_29d0.super_QTextEngine.option._0_4_ & 0xffff3fff;
      local_29d0.super_QTextEngine.option._0_4_ =
           (*(uint *)((long)((_Var1._M_head_impl)->state)._M_t + 0x1b0) & 3) << 0xe | uVar5;
      if ((tf & 0x60000U) != 0) {
        local_29d0.super_QTextEngine._168_1_ = local_29d0.super_QTextEngine._168_1_ | 1;
        local_29d0.super_QTextEngine.option._0_4_ = (uVar5 | (uint)tf >> 3 & 0x4000) ^ 0x4000;
      }
      QTextEngine::itemize(&local_29d0.super_QTextEngine);
      local_2fd8._38_2_ = 0xaaaa;
      local_2fd8.descent.val = 0;
      local_2fd8.ascent.val = 0;
      local_2fd8.leading.val = 0;
      local_2fd8.x.val = 0;
      local_2fd8.y.val = 0;
      local_2fd8.width.val = 0;
      local_2fd8.textWidth.val = 0;
      local_2fd8.textAdvance.val._0_2_ = 0;
      local_2fd8.textAdvance.val._2_2_ = 0;
      local_2fd8.from = 0;
      local_2fd8.trailingSpaces = 0;
      local_2fd8._40_4_ = (uint)(str->d).size & 0xfffffff;
      QTextEngine::shapeLine(&local_29d0.super_QTextEngine,&local_2fd8);
      qVar2 = ((local_29d0.super_QTextEngine.layoutData)->items).d.size;
      memset(&local_2de8,0xaa,0x418);
      uVar5 = (uint)qVar2;
      pQVar10 = (QFontEngine *)(long)(int)uVar5;
      local_2de8 = 0x100;
      local_2de0 = (QFontEngine *)0x0;
      local_2dd8 = local_2dd0;
      if (0x100 < (long)pQVar10) {
        drawText();
      }
      local_2de0 = pQVar10;
      memset(local_2f18 + 0x18,0xaa,0x118);
      local_2f18._24_8_ = (QFontEngine *)0x100;
      local_2f18._32_8_ = (QFontEngine *)0x0;
      local_2f18._40_8_ = local_2ee8;
      if (0x100 < (long)pQVar10) {
        local_2f18._24_8_ = pQVar10;
        __size = (QFontEngine *)QtPrivate::expectedAllocSize((ulong)pQVar10,0x10);
        if (__size == (QFontEngine *)0x0) {
          __size = pQVar10;
        }
        local_2f18._40_8_ = malloc((size_t)__size);
        local_2f18._24_8_ = __size;
      }
      local_2f18._32_8_ = pQVar10;
      if (0 < (int)uVar5) {
        lVar12 = 4;
        uVar13 = 0;
        do {
          pQVar7 = QList<QScriptItem>::data(&(local_29d0.super_QTextEngine.layoutData)->items);
          *(quint8 *)(local_2f18._40_8_ + uVar13) =
               *(quint8 *)((long)&pQVar7->position + lVar12 + 2);
          uVar13 = uVar13 + 1;
          lVar12 = lVar12 + 0x20;
        } while ((uVar5 & 0x7fffffff) != uVar13);
      }
      QTextEngine::bidiReorder(uVar5,(quint8 *)local_2f18._40_8_,local_2dd8);
      if (0 < justificationPadding) {
        local_29d0.super_QTextEngine.option._0_4_ =
             local_29d0.super_QTextEngine.option._0_4_ & 0xfffffe00 | 8;
        local_29d0.super_QTextEngine._168_1_ = local_29d0.super_QTextEngine._168_1_ | 8;
        local_2fd8.width.val = justificationPadding << 6;
        QTextEngine::justify(&local_29d0.super_QTextEngine,&local_2fd8);
      }
      if (0 < (int)uVar5) {
        iVar9 = (int)(p->xp * 64.0);
        uVar13 = 0;
        do {
          iVar6 = local_2dd8[uVar13];
          pQVar3 = ((local_29d0.super_QTextEngine.layoutData)->items).d.ptr;
          si = pQVar3 + iVar6;
          if (((uint)pQVar3[iVar6].analysis & 0xf00) < 0x601) {
            local_2f18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_2f18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            QTextEngine::font((QTextEngine *)local_2f18,(QScriptItem *)&local_29d0);
            local_2f28 = &DAT_aaaaaaaaaaaaaaaa;
            pQStack_2f20 = (QFontEngine *)&DAT_aaaaaaaaaaaaaaaa;
            local_2f38 = (QGlyphJustification *)&DAT_aaaaaaaaaaaaaaaa;
            pQStack_2f30 = (QGlyphAttributes *)&DAT_aaaaaaaaaaaaaaaa;
            local_2f48 = (glyph_t *)&DAT_aaaaaaaaaaaaaaaa;
            pQStack_2f40 = (QFixed *)&DAT_aaaaaaaaaaaaaaaa;
            local_2f58 = (QFont *)&DAT_aaaaaaaaaaaaaaaa;
            pQStack_2f50 = (QFixedPoint *)&DAT_aaaaaaaaaaaaaaaa;
            local_2f68 = (QChar *)&DAT_aaaaaaaaaaaaaaaa;
            puStack_2f60 = (unsigned_short *)&DAT_aaaaaaaaaaaaaaaa;
            auStack_2f80._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            puStack_2f70 = &DAT_aaaaaaaaaaaaaaaa;
            local_2f88 = &DAT_aaaaaaaaaaaaaaaa;
            auStack_2f80._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_2f98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_2f98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            QTextCharFormat::QTextCharFormat((QTextCharFormat *)local_2fa8);
            QTextItemInt::QTextItemInt
                      ((QTextItemInt *)local_2f98,si,(QFont *)local_2f18,
                       (QTextCharFormat *)local_2fa8);
            QTextFormat::~QTextFormat((QTextFormat *)local_2fa8);
            lVar12 = (long)si->glyph_data_offset;
            local_2f48 = ((local_29d0.super_QTextEngine.layoutData)->glyphLayout).glyphs + lVar12;
            pQStack_2f40 = ((local_29d0.super_QTextEngine.layoutData)->glyphLayout).advances +
                           lVar12;
            pQStack_2f50 = ((local_29d0.super_QTextEngine.layoutData)->glyphLayout).offsets + lVar12
            ;
            local_2f38 = ((local_29d0.super_QTextEngine.layoutData)->glyphLayout).justifications +
                         lVar12 * 4;
            pQStack_2f30 = ((local_29d0.super_QTextEngine.layoutData)->glyphLayout).attributes +
                           lVar12;
            local_2f28 = (undefined1 *)CONCAT44(local_2f28._4_4_,(uint)si->num_glyphs);
            pcVar8 = ((local_29d0.super_QTextEngine.layoutData)->string).d.ptr;
            if (pcVar8 == (char16_t *)0x0) {
              pcVar8 = (char16_t *)&QString::_empty;
            }
            local_2f68 = (QChar *)(pcVar8 + si->position);
            iVar6 = QTextEngine::length(&local_29d0.super_QTextEngine,iVar6);
            puStack_2f70 = (undefined1 *)CONCAT44(puStack_2f70._4_4_,iVar6);
            if ((local_29d0.super_QTextEngine._168_1_ & 8) == 0) {
              local_2f98._8_4_ = (si->width).val;
            }
            else if (0 < (long)(int)local_2f28) {
              lVar12 = 0;
              iVar6 = local_2f98._8_4_;
              do {
                iVar11 = (*(uint *)(local_2f38 + lVar12 * 4) >> 8) + pQStack_2f40[lVar12].val;
                if (((byte)pQStack_2f30[lVar12] & 2) != 0) {
                  iVar11 = 0;
                }
                iVar6 = iVar6 + iVar11;
                local_2f98._8_4_ = iVar6;
                lVar12 = lVar12 + 1;
              } while ((int)local_2f28 != lVar12);
            }
            puStack_2f60 = (local_29d0.super_QTextEngine.layoutData)->logClustersPtr + si->position;
            local_2fa8._0_8_ = (double)iVar9 * 0.015625;
            local_2fa8._8_8_ = p->yp;
            QPainterPrivate::drawTextItem
                      ((this->d_ptr)._M_t.
                       super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>
                       .super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl,
                       (QPointF *)local_2fa8,(QTextItem *)local_2f98,(QTextEngine *)0x0);
            iVar6 = local_2f98._8_4_;
            QTextFormat::~QTextFormat((QTextFormat *)auStack_2f80);
            QFont::~QFont((QFont *)local_2f18);
          }
          else {
            iVar6 = (si->width).val;
          }
          iVar9 = iVar9 + iVar6;
          uVar13 = uVar13 + 1;
        } while (uVar13 != (uVar5 & 0x7fffffff));
      }
      if ((quint8 *)local_2f18._40_8_ != local_2ee8) {
        QtPrivate::sizedFree((void *)local_2f18._40_8_,local_2f18._24_8_);
      }
      if (local_2dd8 != local_2dd0) {
        QtPrivate::sizedFree(local_2dd8,local_2de8 << 2);
      }
      QTextEngine::LayoutData::~LayoutData(&local_29d0._layoutData);
      QTextEngine::~QTextEngine(&local_29d0.super_QTextEngine);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPainter::drawText(const QPointF &p, const QString &str, int tf, int justificationPadding)
{
#ifdef QT_DEBUG_DRAW
    if (qt_show_painter_debug_output)
        printf("QPainter::drawText(), pos=[%.2f,%.2f], str='%s'\n", p.x(), p.y(), str.toLatin1().constData());
#endif

    Q_D(QPainter);

    if (!d->engine || str.isEmpty() || pen().style() == Qt::NoPen)
        return;

    Q_DECL_UNINITIALIZED QStackTextEngine engine(str, d->state->font);
    engine.option.setTextDirection(d->state->layoutDirection);
    if (tf & (Qt::TextForceLeftToRight|Qt::TextForceRightToLeft)) {
        engine.ignoreBidi = true;
        engine.option.setTextDirection((tf & Qt::TextForceLeftToRight) ? Qt::LeftToRight : Qt::RightToLeft);
    }
    engine.itemize();
    QScriptLine line;
    line.length = str.size();
    engine.shapeLine(line);

    int nItems = engine.layoutData->items.size();
    QVarLengthArray<int> visualOrder(nItems);
    QVarLengthArray<uchar> levels(nItems);
    for (int i = 0; i < nItems; ++i)
        levels[i] = engine.layoutData->items[i].analysis.bidiLevel;
    QTextEngine::bidiReorder(nItems, levels.data(), visualOrder.data());

    if (justificationPadding > 0) {
        engine.option.setAlignment(Qt::AlignJustify);
        engine.forceJustification = true;
        // this works because justify() is only interested in the difference between width and textWidth
        line.width = justificationPadding;
        engine.justify(line);
    }
    QFixed x = QFixed::fromReal(p.x());

    for (int i = 0; i < nItems; ++i) {
        int item = visualOrder[i];
        const QScriptItem &si = engine.layoutData->items.at(item);
        if (si.analysis.flags >= QScriptAnalysis::TabOrObject) {
            x += si.width;
            continue;
        }
        QFont f = engine.font(si);
        QTextItemInt gf(si, &f);
        gf.glyphs = engine.shapedGlyphs(&si);
        gf.chars = engine.layoutData->string.unicode() + si.position;
        gf.num_chars = engine.length(item);
        if (engine.forceJustification) {
            for (int j=0; j<gf.glyphs.numGlyphs; ++j)
                gf.width += gf.glyphs.effectiveAdvance(j);
        } else {
            gf.width = si.width;
        }
        gf.logClusters = engine.logClusters(&si);

        drawTextItem(QPointF(x.toReal(), p.y()), gf);

        x += gf.width;
    }
}